

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O1

void UnitTest::CheckEqual<char,FIX::OrdType>
               (TestResults *results,char *expected,OrdType *actual,TestDetails *details)

{
  char cVar1;
  char cVar2;
  ostream *poVar3;
  char *failure;
  MemoryOutStream stream;
  char local_1c9;
  undefined1 local_1c8 [408];
  
  cVar1 = *expected;
  cVar2 = FIX::CharField::getValue(&actual->super_CharField);
  if (cVar1 != cVar2) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected ",9);
    local_1c9 = *expected;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,&local_1c9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," but was ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(actual->super_CharField).super_FieldBase.m_string._M_dataplus._M_p,
               (actual->super_CharField).super_FieldBase.m_string._M_string_length);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}